

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void aom_dc_predictor_64x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint8_t uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  
  auVar5 = in_ZMM0._0_16_;
  dc_sum_64(above);
  auVar6 = auVar5;
  dc_sum_64(left);
  auVar6 = vpaddw_avx(auVar6,auVar5);
  uVar4 = (uint8_t)(auVar6._0_4_ + 0x40U >> 7);
  puVar2 = dst + 0x20;
  iVar1 = 0x40;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    puVar2[-0x20] = uVar4;
    puVar2[-0x1f] = uVar4;
    puVar2[-0x1e] = uVar4;
    puVar2[-0x1d] = uVar4;
    puVar2[-0x1c] = uVar4;
    puVar2[-0x1b] = uVar4;
    puVar2[-0x1a] = uVar4;
    puVar2[-0x19] = uVar4;
    puVar2[-0x18] = uVar4;
    puVar2[-0x17] = uVar4;
    puVar2[-0x16] = uVar4;
    puVar2[-0x15] = uVar4;
    puVar2[-0x14] = uVar4;
    puVar2[-0x13] = uVar4;
    puVar2[-0x12] = uVar4;
    puVar2[-0x11] = uVar4;
    puVar2[-0x10] = uVar4;
    puVar2[-0xf] = uVar4;
    puVar2[-0xe] = uVar4;
    puVar2[-0xd] = uVar4;
    puVar2[-0xc] = uVar4;
    puVar2[-0xb] = uVar4;
    puVar2[-10] = uVar4;
    puVar2[-9] = uVar4;
    puVar2[-8] = uVar4;
    puVar2[-7] = uVar4;
    puVar2[-6] = uVar4;
    puVar2[-5] = uVar4;
    puVar2[-4] = uVar4;
    puVar2[-3] = uVar4;
    puVar2[-2] = uVar4;
    puVar2[-1] = uVar4;
    *puVar2 = uVar4;
    puVar2[1] = uVar4;
    puVar2[2] = uVar4;
    puVar2[3] = uVar4;
    puVar2[4] = uVar4;
    puVar2[5] = uVar4;
    puVar2[6] = uVar4;
    puVar2[7] = uVar4;
    puVar2[8] = uVar4;
    puVar2[9] = uVar4;
    puVar2[10] = uVar4;
    puVar2[0xb] = uVar4;
    puVar2[0xc] = uVar4;
    puVar2[0xd] = uVar4;
    puVar2[0xe] = uVar4;
    puVar2[0xf] = uVar4;
    puVar2[0x10] = uVar4;
    puVar2[0x11] = uVar4;
    puVar2[0x12] = uVar4;
    puVar2[0x13] = uVar4;
    puVar2[0x14] = uVar4;
    puVar2[0x15] = uVar4;
    puVar2[0x16] = uVar4;
    puVar2[0x17] = uVar4;
    puVar2[0x18] = uVar4;
    puVar2[0x19] = uVar4;
    puVar2[0x1a] = uVar4;
    puVar2[0x1b] = uVar4;
    puVar2[0x1c] = uVar4;
    puVar2[0x1d] = uVar4;
    puVar2[0x1e] = uVar4;
    puVar2[0x1f] = uVar4;
    puVar2 = puVar2 + stride;
  }
  return;
}

Assistant:

void aom_dc_predictor_64x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  const __m256i sum_above = dc_sum_64(above);
  __m256i sum_left = dc_sum_64(left);
  sum_left = _mm256_add_epi16(sum_left, sum_above);
  uint16_t sum = (uint16_t)_mm_cvtsi128_si32(_mm256_castsi256_si128(sum_left));
  sum += 64;
  sum /= 128;
  const __m256i row = _mm256_set1_epi8((int8_t)sum);
  row_store_64xh(&row, 64, dst, stride);
}